

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O1

void __thiscall
ApprovalTests::Windows::TortoiseDiffReporter::TortoiseDiffReporter(TortoiseDiffReporter *this)

{
  TortoiseTextDiffReporter *this_00;
  TortoiseImageDiffReporter *this_01;
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type local_39;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> local_38;
  TortoiseTextDiffReporter *local_20;
  TortoiseImageDiffReporter *local_18;
  
  this_00 = (TortoiseTextDiffReporter *)operator_new(0x70);
  TortoiseTextDiffReporter::TortoiseTextDiffReporter(this_00);
  local_20 = this_00;
  this_01 = (TortoiseImageDiffReporter *)operator_new(0x70);
  TortoiseImageDiffReporter::TortoiseImageDiffReporter(this_01);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_20;
  local_18 = this_01;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (&local_38,__l,&local_39);
  FirstWorkingReporter::FirstWorkingReporter(&this->super_FirstWorkingReporter,&local_38);
  if (local_38.
      super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_FirstWorkingReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__FirstWorkingReporter_001a6148;
  return;
}

Assistant:

TortoiseDiffReporter::TortoiseDiffReporter()
            : FirstWorkingReporter(
                  {new TortoiseTextDiffReporter(), new TortoiseImageDiffReporter()})
        {
        }